

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

long sock_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  long lVar1;
  int *out;
  
  if (cmd == 8) {
    lVar1 = (long)b->shutdown;
  }
  else {
    lVar1 = 1;
    if (cmd == 9) {
      b->shutdown = (int)num;
    }
    else if (cmd != 0xb) {
      if (cmd == 0x69) {
        if (b->init == 0) {
          lVar1 = -1;
        }
        else {
          lVar1 = (long)b->num;
          if (ptr != (void *)0x0) {
            *(int *)ptr = b->num;
          }
        }
      }
      else if (cmd == 0x68) {
        sock_free(b);
        b->num = *ptr;
        b->shutdown = (int)num;
        b->init = 1;
      }
      else {
        lVar1 = 0;
      }
    }
  }
  return lVar1;
}

Assistant:

static long sock_ctrl(BIO *b, int cmd, long num, void *ptr) {
  switch (cmd) {
    case BIO_C_SET_FD:
      sock_free(b);
      b->num = *static_cast<int *>(ptr);
      b->shutdown = static_cast<int>(num);
      b->init = 1;
      return 1;
    case BIO_C_GET_FD:
      if (b->init) {
        int *out = static_cast<int*>(ptr);
        if (out != nullptr) {
          *out = b->num;
        }
        return b->num;
      }
      return -1;
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}